

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

uint * __thiscall
google::protobuf::RepeatedField<unsigned_int>::Add(RepeatedField<unsigned_int> *this)

{
  uint uVar1;
  uint *puVar2;
  uint *ptr;
  uint32_t size;
  RepeatedField<unsigned_int> *this_local;
  
  uVar1 = this->current_size_;
  if (uVar1 == this->total_size_) {
    Reserve(this,this->total_size_ + 1);
  }
  puVar2 = elements(this);
  this->current_size_ = uVar1 + 1;
  return puVar2 + uVar1;
}

Assistant:

inline Element* RepeatedField<Element>::Add() {
  uint32_t size = current_size_;
  if (static_cast<int>(size) == total_size_) Reserve(total_size_ + 1);
  auto ptr = &elements()[size];
  current_size_ = size + 1;
  return ptr;
}